

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ConvertToSampledImagePass::FindUses
          (ConvertToSampledImagePass *this,Instruction *inst,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *uses,
          Op user_opcode)

{
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *def;
  IRContext *this_00;
  DefUseManager *this_01;
  anon_class_24_3_6ccb8ddd local_68;
  function<void_(spvtools::opt::Instruction_*)> local_50;
  DefUseManager *local_30;
  DefUseManager *def_use_mgr;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *pvStack_20;
  Op user_opcode_local;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *uses_local;
  Instruction *inst_local;
  ConvertToSampledImagePass *this_local;
  
  def_use_mgr._4_4_ = user_opcode;
  pvStack_20 = uses;
  uses_local = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)inst;
  inst_local = (Instruction *)this;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(this_00);
  def = uses_local;
  local_68.uses = pvStack_20;
  local_68.user_opcode = def_use_mgr._4_4_;
  local_68.this = this;
  local_30 = this_01;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::ConvertToSampledImagePass::FindUses(spvtools::opt::Instruction_const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>*,spv::Op)const::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_50,&local_68);
  analysis::DefUseManager::ForEachUser(this_01,(Instruction *)def,&local_50);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_50);
  return;
}

Assistant:

void ConvertToSampledImagePass::FindUses(const Instruction* inst,
                                         std::vector<Instruction*>* uses,
                                         spv::Op user_opcode) const {
  auto* def_use_mgr = context()->get_def_use_mgr();
  def_use_mgr->ForEachUser(inst, [uses, user_opcode, this](Instruction* user) {
    if (user->opcode() == user_opcode) {
      uses->push_back(user);
    } else if (user->opcode() == spv::Op::OpCopyObject) {
      FindUses(user, uses, user_opcode);
    }
  });
}